

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# personal_settings.cpp
# Opt level: O2

void __thiscall PersonalSettings::parse_json(PersonalSettings *this,Json *json)

{
  value_t vVar1;
  _Rb_tree_color _Var2;
  bool bVar3;
  Color CVar4;
  const_reference pvVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  LandstalkerException *pLVar9;
  ulong uVar10;
  long lVar11;
  initializer_list<unsigned_char> __l;
  set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> mandatory_items;
  uint8_t item_id;
  undefined3 uStack_87;
  undefined2 local_84;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar3 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[14],_0>(json,(char (*) [14])"inGameTracker");
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&mandatory_items,"inGameTracker",(allocator<char> *)&item_id);
    pvVar5 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,(key_type *)&mandatory_items);
    bVar3 = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::get_impl<bool,_0>(pvVar5);
    this->_add_ingame_item_tracker = bVar3;
    std::__cxx11::string::~string((string *)&mandatory_items);
  }
  bVar3 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[9],_0>(json,(char (*) [9])"hudColor");
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&mandatory_items,"hudColor",(allocator<char> *)&item_id);
    pvVar5 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,(key_type *)&mandatory_items);
    CVar4 = Color::from_json(pvVar5);
    this->_hud_color = CVar4;
    std::__cxx11::string::~string((string *)&mandatory_items);
  }
  bVar3 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[11],_0>(json,(char (*) [11])"nigelColor");
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&mandatory_items,"nigelColor",(allocator<char> *)&item_id);
    pvVar5 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,(key_type *)&mandatory_items);
    vVar1 = pvVar5->m_type;
    std::__cxx11::string::~string((string *)&mandatory_items);
    if (vVar1 == array) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&mandatory_items,"nigelColor",(allocator<char> *)&item_id);
      pvVar5 = nlohmann::
               basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(json,(key_type *)&mandatory_items);
      pvVar5 = nlohmann::
               basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator[](pvVar5,0);
      CVar4 = Color::from_json(pvVar5);
      (this->_nigel_colors).first = CVar4;
      std::__cxx11::string::~string((string *)&mandatory_items);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&mandatory_items,"nigelColor",(allocator<char> *)&item_id);
      pvVar5 = nlohmann::
               basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(json,(key_type *)&mandatory_items);
      pvVar5 = nlohmann::
               basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator[](pvVar5,1);
      CVar4 = Color::from_json(pvVar5);
      (this->_nigel_colors).second = CVar4;
      std::__cxx11::string::~string((string *)&mandatory_items);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&mandatory_items,"nigelColor",(allocator<char> *)&item_id);
      pvVar5 = nlohmann::
               basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(json,(key_type *)&mandatory_items);
      CVar4 = Color::from_json(pvVar5);
      (this->_nigel_colors).first = CVar4;
      std::__cxx11::string::~string((string *)&mandatory_items);
      CVar4 = Color::subtract(&(this->_nigel_colors).first,'@');
      (this->_nigel_colors).second = CVar4;
    }
  }
  bVar3 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[12],_0>(json,(char (*) [12])"removeMusic");
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&mandatory_items,"removeMusic",(allocator<char> *)&item_id);
    pvVar5 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,(key_type *)&mandatory_items);
    bVar3 = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::get_impl<bool,_0>(pvVar5);
    this->_remove_music = bVar3;
    std::__cxx11::string::~string((string *)&mandatory_items);
  }
  bVar3 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[19],_0>(json,(char (*) [19])"swapOverworldMusic");
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&mandatory_items,"swapOverworldMusic",(allocator<char> *)&item_id);
    pvVar5 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,(key_type *)&mandatory_items);
    bVar3 = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::get_impl<bool,_0>(pvVar5);
    this->_swap_overworld_music = bVar3;
    std::__cxx11::string::~string((string *)&mandatory_items);
  }
  bVar3 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[15],_0>(json,(char (*) [15])"inventoryOrder");
  if (bVar3) {
    (this->_inventory_order)._M_elems[0x10] = 0xff;
    (this->_inventory_order)._M_elems[0x11] = 0xff;
    (this->_inventory_order)._M_elems[0x12] = 0xff;
    (this->_inventory_order)._M_elems[0x13] = 0xff;
    (this->_inventory_order)._M_elems[0x14] = 0xff;
    (this->_inventory_order)._M_elems[0x15] = 0xff;
    (this->_inventory_order)._M_elems[0x16] = 0xff;
    (this->_inventory_order)._M_elems[0x17] = 0xff;
    (this->_inventory_order)._M_elems[0x18] = 0xff;
    (this->_inventory_order)._M_elems[0x19] = 0xff;
    (this->_inventory_order)._M_elems[0x1a] = 0xff;
    (this->_inventory_order)._M_elems[0x1b] = 0xff;
    (this->_inventory_order)._M_elems[0x1c] = 0xff;
    (this->_inventory_order)._M_elems[0x1d] = 0xff;
    (this->_inventory_order)._M_elems[0x1e] = 0xff;
    (this->_inventory_order)._M_elems[0x1f] = 0xff;
    (this->_inventory_order)._M_elems[0x20] = 0xff;
    (this->_inventory_order)._M_elems[0x21] = 0xff;
    (this->_inventory_order)._M_elems[0x22] = 0xff;
    (this->_inventory_order)._M_elems[0x23] = 0xff;
    (this->_inventory_order)._M_elems[0x24] = 0xff;
    (this->_inventory_order)._M_elems[0x25] = 0xff;
    (this->_inventory_order)._M_elems[0x26] = 0xff;
    (this->_inventory_order)._M_elems[0x27] = 0xff;
    (this->_inventory_order)._M_elems[0] = 0xff;
    (this->_inventory_order)._M_elems[1] = 0xff;
    (this->_inventory_order)._M_elems[2] = 0xff;
    (this->_inventory_order)._M_elems[3] = 0xff;
    (this->_inventory_order)._M_elems[4] = 0xff;
    (this->_inventory_order)._M_elems[5] = 0xff;
    (this->_inventory_order)._M_elems[6] = 0xff;
    (this->_inventory_order)._M_elems[7] = 0xff;
    (this->_inventory_order)._M_elems[8] = 0xff;
    (this->_inventory_order)._M_elems[9] = 0xff;
    (this->_inventory_order)._M_elems[10] = 0xff;
    (this->_inventory_order)._M_elems[0xb] = 0xff;
    (this->_inventory_order)._M_elems[0xc] = 0xff;
    (this->_inventory_order)._M_elems[0xd] = 0xff;
    (this->_inventory_order)._M_elems[0xe] = 0xff;
    (this->_inventory_order)._M_elems[0xf] = 0xff;
    _item_id = 0x2f1b3132;
    local_84 = 0x202b;
    __l._M_len = 6;
    __l._M_array = &item_id;
    std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::set
              (&mandatory_items,__l,(less<unsigned_char> *)&local_50,(allocator_type *)&items);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&item_id,"inventoryOrder",(allocator<char> *)&local_50);
    pvVar5 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,(key_type *)&item_id);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::
    get_impl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
              (&items,pvVar5);
    std::__cxx11::string::~string((string *)&item_id);
    lVar11 = 0;
    for (uVar10 = 0;
        (uVar10 < 0x28 &&
        (uVar10 < (ulong)((long)items.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)items.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5)));
        uVar10 = uVar10 + 1) {
      sVar6 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
              ::count(&this->_item_names,
                      (key_type *)
                      ((long)&((items.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar11));
      if (sVar6 == 0) {
        pLVar9 = (LandstalkerException *)__cxa_allocate_exception(0x28);
        std::operator+(&local_50,"Unknown item name \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&((items.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar11));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&item_id
                       ,&local_50,"\' in inventory order section of personal settings file.");
        LandstalkerException::LandstalkerException(pLVar9,(string *)&item_id);
        __cxa_throw(pLVar9,&LandstalkerException::typeinfo,
                    LandstalkerException::~LandstalkerException);
      }
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
               ::operator[](&this->_item_names,
                            (key_type *)
                            ((long)&((items.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar11));
      _item_id = CONCAT31(uStack_87,*pmVar7);
      (this->_inventory_order)._M_elems[uVar10] = *pmVar7;
      bVar3 = std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::
              contains(&mandatory_items,(key_type_conflict *)&item_id);
      if (bVar3) {
        std::
        _Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
        ::erase(&mandatory_items._M_t,(key_type_conflict *)&item_id);
      }
      lVar11 = lVar11 + 0x20;
    }
    if (mandatory_items._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      _Var2 = mandatory_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
      for (p_Var8 = (this->_item_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 != &(this->_item_names)._M_t._M_impl.super__Rb_tree_header;
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        if ((char)p_Var8[2]._M_color == (char)_Var2) {
          pLVar9 = (LandstalkerException *)__cxa_allocate_exception(0x28);
          std::operator+(&local_50,"Cannot omit ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var8 + 1));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &item_id,&local_50,
                         " from inventory order since it could make seeds uncompletable");
          LandstalkerException::LandstalkerException(pLVar9,(string *)&item_id);
          __cxa_throw(pLVar9,&LandstalkerException::typeinfo,
                      LandstalkerException::~LandstalkerException);
        }
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&items);
    std::
    _Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
    ::~_Rb_tree(&mandatory_items._M_t);
  }
  return;
}

Assistant:

void PersonalSettings::parse_json(const Json& json)
{
    if(json.contains("inGameTracker"))
        _add_ingame_item_tracker = json.at("inGameTracker");

    if(json.contains("hudColor"))
        _hud_color = Color::from_json(json.at("hudColor"));

    if(json.contains("nigelColor"))
    {
        if(json.at("nigelColor").is_array())
        {
            _nigel_colors.first = Color::from_json(json.at("nigelColor")[0]);
            _nigel_colors.second = Color::from_json(json.at("nigelColor")[1]);
        }
        else
        {
            _nigel_colors.first = Color::from_json(json.at("nigelColor"));
            _nigel_colors.second = _nigel_colors.first.subtract(0x40);
        }
    }

    if(json.contains("removeMusic"))
        _remove_music = json.at("removeMusic");

    if(json.contains("swapOverworldMusic"))
        _swap_overworld_music = json.at("swapOverworldMusic");

    if(json.contains("inventoryOrder"))
    {
        _inventory_order.fill(0xFF);

        std::set<uint8_t> mandatory_items = {
            ITEM_KEY, ITEM_IDOL_STONE, ITEM_GARLIC, ITEM_LOGS, ITEM_GOLA_EYE, ITEM_EINSTEIN_WHISTLE
        };

        std::vector<std::string> items = json.at("inventoryOrder");
        for(uint8_t i=0 ; i < items.size() && i < _inventory_order.size() ; ++i)
        {
            if(!_item_names.count(items[i]))
                throw LandstalkerException("Unknown item name '" + items[i] + "' in inventory order section of personal settings file.");
            uint8_t item_id = _item_names[items[i]];
            _inventory_order[i] = item_id;

            if(mandatory_items.contains(item_id))
                mandatory_items.erase(item_id);
        }

        if(!mandatory_items.empty())
        {
            uint8_t first_missing_item_id = *mandatory_items.begin();
            for(auto& [item_name, item_id] : _item_names)
                if(item_id == first_missing_item_id)
                    throw LandstalkerException("Cannot omit " + item_name + " from inventory order since it could make seeds uncompletable");
        }
    }
}